

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packing.cpp
# Opt level: O1

int __thiscall ncnn::Packing::forward(Packing *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  uint _h;
  int *piVar3;
  ulong uVar4;
  void *pvVar5;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  size_t sVar16;
  long lVar17;
  long lVar18;
  ulong local_60;
  
  iVar1 = bottom_blob->elempack;
  uVar14 = (ulong)iVar1;
  iVar9 = this->out_elempack;
  uVar15 = (ulong)iVar9;
  if (iVar1 == iVar9) goto LAB_00175af3;
  iVar2 = bottom_blob->w;
  lVar13 = (long)iVar2;
  _h = bottom_blob->h;
  iVar10 = bottom_blob->c;
  iVar12 = bottom_blob->dims;
  uVar4 = bottom_blob->elemsize;
  if (this->use_padding == 0) {
    if (iVar12 != 3) {
      if (iVar12 != 2) {
        if (iVar12 != 1) {
          return 0;
        }
        if ((iVar2 * iVar1) % iVar9 != 0) goto LAB_00175af3;
        goto LAB_00175b91;
      }
      if ((int)(_h * iVar1) % iVar9 != 0) {
LAB_00175af3:
        if (top_blob != bottom_blob) {
          piVar3 = bottom_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + 1;
            UNLOCK();
          }
          piVar3 = top_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (**(code **)(*(long *)top_blob->allocator + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->c = 0;
          top_blob->cstep = 0;
          piVar3 = bottom_blob->refcount;
          top_blob->data = bottom_blob->data;
          top_blob->refcount = piVar3;
          top_blob->elemsize = bottom_blob->elemsize;
          top_blob->elempack = bottom_blob->elempack;
          top_blob->allocator = bottom_blob->allocator;
          iVar1 = bottom_blob->w;
          iVar9 = bottom_blob->h;
          iVar2 = bottom_blob->c;
          top_blob->dims = bottom_blob->dims;
          top_blob->w = iVar1;
          top_blob->h = iVar9;
          top_blob->c = iVar2;
          top_blob->cstep = bottom_blob->cstep;
          return 0;
        }
        return 0;
      }
      goto LAB_00175c62;
    }
    if ((iVar10 * iVar1) % iVar9 != 0) goto LAB_00175af3;
  }
  if (iVar12 == 3) {
    uVar8 = (long)(iVar10 * iVar1 + iVar9 + -1) / (long)iVar9;
    sVar16 = (uVar4 / uVar14) * uVar15;
    uVar15 = sVar16 / uVar15;
    iVar12 = (int)uVar8;
    Mat::create(top_blob,iVar2,_h,iVar12,sVar16,iVar9,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    if (iVar12 < 1) {
      return 0;
    }
    uVar14 = 0;
    do {
      if (0 < (int)_h) {
        sVar6 = top_blob->cstep;
        sVar7 = top_blob->elemsize;
        pvVar5 = top_blob->data;
        local_60 = 0;
        do {
          if (0 < iVar2) {
            lVar17 = 0;
            do {
              uVar11 = (ulong)(uint)this->out_elempack;
              if (0 < this->out_elempack) {
                lVar18 = 0;
                do {
                  iVar9 = (int)uVar11 * (int)uVar14 + (int)lVar18;
                  iVar12 = iVar9 / iVar1;
                  if (iVar10 <= iVar12) break;
                  memcpy((void *)((long)pvVar5 +
                                 uVar15 * lVar18 +
                                 sVar16 * lVar17 +
                                 sVar16 * local_60 * lVar13 + sVar6 * uVar14 * sVar7),
                         (void *)((long)bottom_blob->data +
                                 (long)(iVar9 % iVar1) * uVar15 +
                                 uVar4 * lVar17 + local_60 * lVar13 * uVar4 +
                                 (long)iVar12 * bottom_blob->cstep * bottom_blob->elemsize),uVar15);
                  lVar18 = lVar18 + 1;
                  uVar11 = (ulong)this->out_elempack;
                } while (lVar18 < (long)uVar11);
              }
              lVar17 = lVar17 + 1;
            } while (lVar17 != lVar13);
          }
          local_60 = local_60 + 1;
        } while (local_60 != _h);
      }
      uVar14 = uVar14 + 1;
      if (uVar14 == (uVar8 & 0xffffffff)) {
        return 0;
      }
    } while( true );
  }
  if (iVar12 != 2) {
    if (iVar12 != 1) {
      return 0;
    }
LAB_00175b91:
    if (iVar9 == 1) {
      if (top_blob != bottom_blob) {
        piVar3 = bottom_blob->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + 1;
          UNLOCK();
        }
        piVar3 = top_blob->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (**(code **)(*(long *)top_blob->allocator + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->c = 0;
        top_blob->cstep = 0;
        piVar3 = bottom_blob->refcount;
        top_blob->data = bottom_blob->data;
        top_blob->refcount = piVar3;
        top_blob->elemsize = bottom_blob->elemsize;
        top_blob->elempack = bottom_blob->elempack;
        top_blob->allocator = bottom_blob->allocator;
        iVar9 = bottom_blob->w;
        iVar10 = bottom_blob->h;
        iVar12 = bottom_blob->c;
        top_blob->dims = bottom_blob->dims;
        top_blob->w = iVar9;
        top_blob->h = iVar10;
        top_blob->c = iVar12;
        top_blob->cstep = bottom_blob->cstep;
      }
      top_blob->w = iVar1 * iVar2;
      top_blob->cstep = (long)(iVar1 * iVar2);
      top_blob->elemsize = uVar4 / uVar14;
      top_blob->elempack = this->out_elempack;
      return 0;
    }
    Mat::create(top_blob,(iVar1 * iVar2 + iVar9 + -1) / iVar9,uVar15 * (uVar4 / uVar14),iVar9,
                opt->blob_allocator);
    if (top_blob->data != (void *)0x0) {
      if ((long)top_blob->c * top_blob->cstep != 0) {
        memcpy(top_blob->data,bottom_blob->data,uVar4 * lVar13);
        return 0;
      }
      return -100;
    }
    return -100;
  }
LAB_00175c62:
  uVar8 = (long)(int)(iVar1 * _h + iVar9 + -1) / (long)iVar9;
  sVar16 = (uVar4 / uVar14) * uVar15;
  uVar15 = sVar16 / uVar15;
  iVar10 = (int)uVar8;
  Mat::create(top_blob,iVar2,iVar10,sVar16,iVar9,opt->blob_allocator);
  if (top_blob->data == (void *)0x0) {
    return -100;
  }
  if ((long)top_blob->c * top_blob->cstep == 0) {
    return -100;
  }
  if (iVar10 < 1) {
    return 0;
  }
  uVar14 = 0;
  do {
    if (0 < iVar2) {
      pvVar5 = top_blob->data;
      lVar17 = 0;
      do {
        uVar11 = (ulong)(uint)this->out_elempack;
        if (0 < this->out_elempack) {
          lVar18 = 0;
          do {
            iVar9 = (int)uVar11 * (int)uVar14 + (int)lVar18;
            iVar10 = iVar9 / iVar1;
            if ((int)_h <= iVar10) break;
            memcpy((void *)((long)pvVar5 +
                           uVar15 * lVar18 + sVar16 * lVar17 + uVar14 * lVar13 * sVar16),
                   (void *)((long)bottom_blob->data +
                           (long)(iVar9 % iVar1) * uVar15 + uVar4 * lVar17 +
                           (long)(iVar10 * iVar2) * uVar4),uVar15);
            lVar18 = lVar18 + 1;
            uVar11 = (ulong)this->out_elempack;
          } while (lVar18 < (long)uVar11);
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != lVar13);
    }
    uVar14 = uVar14 + 1;
    if (uVar14 == (uVar8 & 0xffffffff)) {
      return 0;
    }
  } while( true );
}

Assistant:

int Packing::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elempack = bottom_blob.elempack;

    if (elempack == out_elempack)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    if (!use_padding)
    {
        // identity if use_padding not allowed
        if (dims == 1 && w * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
        if (dims == 2 && h * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
        if (dims == 3 && channels * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
    }

    if (dims == 1)
    {
        if (out_elempack == 1)
        {
            top_blob = bottom_blob;
            top_blob.w = w * elempack;
            top_blob.cstep = w * elempack;
            top_blob.elemsize = elemsize / elempack;
            top_blob.elempack = out_elempack;
            return 0;
        }

        int outw = (w * elempack + out_elempack - 1) / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;

        top_blob.create(outw, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        memcpy(top_blob.data, bottom_blob.data, w * elemsize);

        return 0;
    }

    if (dims == 2)
    {
        int outh = (h * elempack + out_elempack - 1) / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;
        size_t lane_size = out_elemsize / out_elempack;

        top_blob.create(w, outh, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for
        for (int i = 0; i < outh; i++)
        {
            unsigned char* outptr = (unsigned char*)top_blob + i * w * out_elemsize;

            for (int j = 0; j < w; j++)
            {
                unsigned char* out_elem_ptr = outptr + j * out_elemsize;

                for (int k = 0; k < out_elempack; k++)
                {
                    int srcy = (i * out_elempack + k) / elempack;
                    if (srcy >= h)
                        break;

                    int srck = (i * out_elempack + k) % elempack;

                    const unsigned char* ptr = (const unsigned char*)bottom_blob + srcy * w * elemsize;
                    const unsigned char* elem_ptr = ptr + j * elemsize;

                    memcpy(out_elem_ptr + k * lane_size, elem_ptr + srck * lane_size, lane_size);
                }
            }
        }

        return 0;
    }

    if (dims == 3)
    {
        int outc = (channels * elempack + out_elempack - 1) / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;
        size_t lane_size = out_elemsize / out_elempack;

        top_blob.create(w, h, outc, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for
        for (int q = 0; q < outc; q++)
        {
            Mat out = top_blob.channel(q);

            for (int i = 0; i < h; i++)
            {
                unsigned char* outptr = (unsigned char*)out + i * w * out_elemsize;

                for (int j = 0; j < w; j++)
                {
                    unsigned char* out_elem_ptr = outptr + j * out_elemsize;

                    for (int k = 0; k < out_elempack; k++)
                    {
                        int srcq = (q * out_elempack + k) / elempack;
                        if (srcq >= channels)
                            break;

                        int srck = (q * out_elempack + k) % elempack;

                        const Mat m = bottom_blob.channel(srcq);
                        const unsigned char* ptr = (const unsigned char*)m + i * w * elemsize;
                        const unsigned char* elem_ptr = ptr + j * elemsize;

                        memcpy(out_elem_ptr + k * lane_size, elem_ptr + srck * lane_size, lane_size);
                    }
                }
            }
        }

        return 0;
    }

    return 0;
}